

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsParallel.h
# Opt level: O0

void highs::parallel::initialize_scheduler(int numThreads)

{
  int in_EDI;
  
  if (in_EDI == 0) {
    std::thread::hardware_concurrency();
  }
  HighsTaskExecutor::initialize(numThreads);
  return;
}

Assistant:

inline void initialize_scheduler(int numThreads = 0) {
  if (numThreads == 0) {
#ifdef HIGHS_NO_DEFAULT_THREADS
    numThreads = 1;
#else
    numThreads = (std::thread::hardware_concurrency() + 1) / 2;
#endif
  }
  HighsTaskExecutor::initialize(numThreads);
}